

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O3

void __thiscall rsg::TexLookup::~TexLookup(TexLookup *this)

{
  pointer pSVar1;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__TexLookup_0217f710;
  if (this->m_coordExpr != (Expression *)0x0) {
    (*this->m_coordExpr->_vptr_Expression[1])();
  }
  if (this->m_lodBiasExpr != (Expression *)0x0) {
    (*this->m_lodBiasExpr->_vptr_Expression[1])();
  }
  pSVar1 = (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->m_value).m_value.
                                 super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  VariableType::~VariableType(&this->m_valueType);
  return;
}

Assistant:

TexLookup::~TexLookup (void)
{
	delete m_coordExpr;
	delete m_lodBiasExpr;
}